

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::HandleTimestampCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  bool bVar9;
  ulong uVar10;
  string formatString;
  string result;
  cmTimestamp timestamp;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  uVar7 = lVar5 >> 5;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (uVar7 < 2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"sub-command TIMESTAMP requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_90);
LAB_002536bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  if (4 < uVar7) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"sub-command TIMESTAMP takes at most three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    goto LAB_002536bf;
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar7 = 2;
  if ((lVar5 != 0x40) && (iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 2)), iVar4 != 0))
  {
    uVar7 = 3;
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
  if (uVar7 < uVar10) {
    iVar4 = std::__cxx11::string::compare
                      ((char *)((long)&(pbVar3->_M_dataplus)._M_p + (ulong)(uint)((int)uVar7 << 5)))
    ;
    if (iVar4 != 0) {
      std::operator+(&local_50," TIMESTAMP sub-command does not recognize option ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     (ulong)(uint)((int)uVar7 << 5)));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_70.field_2._M_allocated_capacity = *psVar8;
        local_70.field_2._8_8_ = plVar6[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar8;
        local_70._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_70._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&this->super_cmCommand,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar9 = false;
      goto LAB_00253865;
    }
  }
  cmTimestamp::CurrentTime(&local_70,(cmTimestamp *)&local_50,&local_90,uVar7 < uVar10);
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar2 + 1,local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
LAB_00253865:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    return bVar9;
  }
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                           local_90.field_2._M_local_buf[0]) + 1);
  return bVar9;
}

Assistant:

bool cmStringCommand::HandleTimestampCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command TIMESTAMP requires at least one argument.");
    return false;
  }
  if (args.size() > 4) {
    this->SetError("sub-command TIMESTAMP takes at most three arguments.");
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& outputVariable = args[argsIndex++];

  std::string formatString;
  if (args.size() > argsIndex && args[argsIndex] != "UTC") {
    formatString = args[argsIndex++];
  }

  bool utcFlag = false;
  if (args.size() > argsIndex) {
    if (args[argsIndex] == "UTC") {
      utcFlag = true;
    } else {
      std::string e = " TIMESTAMP sub-command does not recognize option " +
        args[argsIndex] + ".";
      this->SetError(e);
      return false;
    }
  }

  cmTimestamp timestamp;
  std::string result = timestamp.CurrentTime(formatString, utcFlag);
  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}